

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O0

void envy_bios_print_bit_d(envy_bios *bios,FILE *out,uint mask)

{
  char *local_40;
  char *name;
  int local_30;
  int i;
  int ret;
  uint16_t addr;
  envy_bios_d *d;
  FILE *pFStack_18;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  _ret = &bios->d;
  local_30 = 0;
  name._4_4_ = 0;
  if ((_ret->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x1000000) != 0)) {
    d._4_4_ = mask;
    pFStack_18 = (FILE *)out;
    out_local = (FILE *)bios;
    fprintf((FILE *)out,"BIT table \'d\' at 0x%x, version %i\n",(ulong)_ret->bit->offset,
            (ulong)_ret->bit->version);
    for (name._4_4_ = 0; (int)(name._4_4_ * 2) < (int)(uint)_ret->bit->t_len;
        name._4_4_ = name._4_4_ + 1) {
      local_30 = bios_u16((envy_bios *)out_local,(uint)_ret->bit->t_offset + name._4_4_ * 2,
                          (uint16_t *)((long)&i + 2));
      if ((local_30 == 0) && (i._2_2_ != 0)) {
        local_30 = parse_at((envy_bios *)out_local,name._4_4_,&local_40);
        fprintf(pFStack_18,"0x%02x: 0x%x => d %s\n",(ulong)(name._4_4_ << 1),(ulong)i._2_2_,local_40
               );
      }
    }
    fprintf(pFStack_18,"\n");
  }
  return;
}

Assistant:

void
envy_bios_print_bit_d(struct envy_bios *bios, FILE *out, unsigned mask)
{
	struct envy_bios_d *d = &bios->d;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!d->bit || !(mask & ENVY_BIOS_PRINT_d))
		return;

	fprintf(out, "BIT table 'd' at 0x%x, version %i\n",
		d->bit->offset, d->bit->version);

	for (i = 0; i * 2 < d->bit->t_len; ++i) {
		ret = bios_u16(bios, d->bit->t_offset + (i * 2), &addr);
		if (!ret && addr) {
			const char *name;
			ret = parse_at(bios, i, &name);
			fprintf(out, "0x%02x: 0x%x => d %s\n", i * 2, addr, name);
		}
	}

	fprintf(out, "\n");
}